

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  _Bool *p_Var1;
  int *piVar2;
  long *plVar3;
  char **ppcVar4;
  char cVar5;
  _func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *p_Var6;
  contenc_writer *writer;
  curl_off_t *pcVar7;
  curl_off_t cVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  _Bool _Var18;
  CURLcode CVar19;
  CHUNKcode code;
  int iVar20;
  CURLcode CVar21;
  size_t sVar22;
  long lVar23;
  char *pcVar24;
  timediff_t tVar25;
  _Bool *p_Var26;
  size_t sVar27;
  Curl_handler *pCVar28;
  _Bool *p_Var29;
  ulong uVar30;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong uVar31;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  char *pcVar32;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  _Bool *p_Var33;
  uint uVar34;
  long lVar35;
  long lVar36;
  curl_socket_t readfd0;
  uint uVar37;
  int iVar38;
  bool bVar39;
  curltime cVar40;
  curltime older;
  curltime older_00;
  curltime newer;
  curltime newer_00;
  _Bool readmore;
  ssize_t bytes_written;
  CURLcode local_68;
  _Bool local_61;
  ulong local_60;
  uint local_54;
  _Bool *local_50;
  uint local_44;
  long local_40;
  _Bool *local_38;
  
  uVar34 = conn->cselect_bits;
  conn->cselect_bits = 0;
  uVar37 = (data->req).keepon;
  uVar30 = 0xffffffff;
  readfd0 = -1;
  if ((uVar37 & 0x15) == 1) {
    readfd0 = conn->sockfd;
  }
  if ((uVar37 & 0x2a) == 2) {
    uVar30 = (ulong)(uint)conn->writesockfd;
  }
  uVar34 = uVar34 | (conn->data->state).drain != 0;
  if (uVar34 == 0) {
    uVar34 = Curl_socket_check(readfd0,-1,(curl_socket_t)uVar30,0);
    uVar30 = extraout_RDX;
  }
  if (uVar34 == 4) {
    Curl_failf(data,"select/poll returned error");
    comeback = (_Bool *)0x37;
    goto LAB_0043987f;
  }
  uVar37 = 0;
  if ((((data->req).keepon & 1) != 0) &&
     (((uVar34 & 1) != 0 || (uVar37 = 0, (conn->bits).stream_was_rewound == true)))) {
    readmore = false;
    *done = false;
    *comeback = false;
    iVar20 = 100;
    local_60 = local_60 & 0xffffffff00000000;
    local_40 = 0;
    CVar19 = CURLE_OK;
    local_50 = done;
    local_44 = uVar34;
    local_38 = comeback;
    do {
      sVar27 = (data->set).buffer_size;
      lVar23 = (data->req).size;
      if (((lVar23 != -1) && ((data->req).header == false)) &&
         (sVar22 = lVar23 - (data->req).bytecount, (long)sVar22 < (long)sVar27)) {
        sVar27 = sVar22;
      }
      if (sVar27 == 0) {
        bytes_written = 0;
LAB_00438b0e:
        if ((((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) &&
           (Curl_pgrsTime(data,TIMER_STARTTRANSFER), uVar30 = extraout_RDX_01,
           (data->req).exp100 != EXP100_SEND_DATA)) {
          cVar40 = Curl_now();
          uVar30 = cVar40._8_8_;
          (data->req).start100.tv_sec = cVar40.tv_sec;
          (data->req).start100.tv_usec = cVar40.tv_usec;
        }
        if (bytes_written == 0) {
          uVar30 = CONCAT71((int7)(uVar30 >> 8),(data->req).bodywrites == 0);
        }
        else {
          uVar30 = 0;
        }
        if (bytes_written < 1 && (uVar30 & 1) == 0) {
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
          iVar38 = 2;
          local_60 = CONCAT44(local_60._4_4_,1);
        }
        else {
          (data->req).buf[bytes_written] = '\0';
          (data->req).str = (data->req).buf;
          p_Var6 = conn->handler->readwrite;
          if (p_Var6 != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0) {
            uVar30 = uVar30 & 0xffffffff;
            CVar19 = (*p_Var6)(data,conn,&bytes_written,&readmore);
            local_60 = CONCAT44(local_60._4_4_,1);
            uVar31 = extraout_RDX_02;
            if (CVar19 != CURLE_OK) goto LAB_00438bc0;
            CVar19 = CURLE_OK;
            iVar38 = 2;
            if (readmore != false) goto LAB_00438be2;
          }
          if ((data->req).header == true) {
            local_54 = (uint)uVar30;
            local_61 = false;
            CVar21 = Curl_http_readwrite_headers(data,conn,&bytes_written,&local_61);
            local_60 = CONCAT44(local_60._4_4_,1);
            if (CVar21 == CURLE_OK) {
              p_Var6 = conn->handler->readwrite;
              uVar30 = (ulong)local_54;
              if (((p_Var6 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)
                              0x0) || (0 < (data->req).maxdownload)) || (bytes_written < 1)) {
LAB_00438dc3:
                if (local_61 == true) {
                  iVar38 = 2;
                  if (0 < bytes_written) {
                    _Var18 = Curl_pipeline_wanted(conn->data->multi,1);
                    if (_Var18) {
                      Curl_infof(data,
                                 "Rewinding stream by : %zd bytes on url %s (zero-length body)\n",
                                 bytes_written);
                      conn->read_pos = conn->read_pos - bytes_written;
                      (conn->bits).stream_was_rewound = true;
                    }
                    else {
                      Curl_infof(data,
                                 "Excess found in a non pipelined read: excess = %zd url = %s (zero-length body)\n"
                                 ,bytes_written);
                    }
                    CVar19 = CURLE_OK;
                    goto LAB_00438c74;
                  }
                  bVar39 = false;
                }
                else {
                  iVar38 = 0;
                  bVar39 = true;
                }
                CVar19 = CURLE_OK;
              }
              else {
                CVar21 = (*p_Var6)(data,conn,&bytes_written,&readmore);
                CVar19 = CURLE_OK;
                if (CVar21 != CURLE_OK) goto LAB_00438c70;
                uVar30 = (ulong)local_54;
                if (readmore == false) goto LAB_00438dc3;
                iVar38 = 2;
                bVar39 = false;
              }
            }
            else {
LAB_00438c70:
              CVar19 = CVar21;
              iVar38 = 1;
              local_68 = CVar19;
LAB_00438c74:
              bVar39 = false;
              uVar30 = (ulong)local_54;
            }
            if (!bVar39) goto LAB_00438be2;
          }
          if ((((data->req).str != (char *)0x0) && ((data->req).header == false)) &&
             (0 < bytes_written || (uVar30 & 1) != 0)) {
            if ((data->set).opt_no_body == true) {
              Curl_conncontrol(conn,2);
              *local_50 = true;
              local_68 = CURLE_WEIRD_SERVER_REPLY;
              uVar30 = extraout_RDX_04;
LAB_00438cd9:
              local_60 = CONCAT44(local_60._4_4_,1);
LAB_00438ce1:
              iVar38 = 1;
              goto LAB_00438be2;
            }
            if (((data->req).bodywrites == 0 && (uVar30 & 1) == 0) &&
               ((conn->handler->protocol & 0x40003) != 0)) {
              if ((data->req).newurl != (char *)0x0) {
                if ((conn->bits).close == true) {
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                  *local_50 = true;
                  local_68 = CURLE_OK;
                  goto LAB_00438cd9;
                }
                (data->req).ignorebody = true;
                uVar30 = uVar30 & 0xffffffff;
                Curl_infof(data,"Ignoring the response-body\n");
              }
              lVar23 = (data->state).resume_from;
              if (((lVar23 != 0) && ((data->req).content_range == false)) &&
                 (((data->set).httpreq == HTTPREQ_GET && ((data->req).ignorebody == false)))) {
                if ((data->req).size != lVar23) {
                  Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume."
                            );
                  local_68 = CURLE_RANGE_ERROR;
                  uVar30 = extraout_RDX_09;
                  goto LAB_00438cd9;
                }
                local_68 = CURLE_OK;
                Curl_infof(data,"The entire document is already downloaded");
                local_60 = CONCAT44(local_60._4_4_,1);
                Curl_conncontrol(conn,1);
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                *local_50 = true;
                uVar30 = extraout_RDX_08;
                goto LAB_00438ce1;
              }
              if (((data->set).timecondition != CURL_TIMECOND_NONE) &&
                 ((data->state).range == (char *)0x0)) {
                uVar30 = uVar30 & 0xffffffff;
                _Var18 = Curl_meets_timecondition(data,(data->req).timeofdoc);
                if (!_Var18) {
                  *local_50 = true;
                  (data->info).httpcode = 0x130;
                  local_68 = CURLE_OK;
                  Curl_infof(data,"Simulate a HTTP 304 response!\n");
                  local_60 = CONCAT44(local_60._4_4_,1);
                  Curl_conncontrol(conn,1);
                  uVar30 = extraout_RDX_07;
                  goto LAB_00438ce1;
                }
              }
            }
            plVar3 = &(data->req).bodywrites;
            *plVar3 = *plVar3 + 1;
            uVar31 = uVar30;
            if (((data->set).verbose == true) &&
               ((uVar31 = uVar30 & 0xffffffff, (data->req).badheader == HEADER_NORMAL ||
                (Curl_debug(data,CURLINFO_DATA_IN,(data->state).headerbuff,(data->req).hbuflen),
                (data->req).badheader == HEADER_PARTHEADER)))) {
              Curl_debug(data,CURLINFO_DATA_IN,(data->req).str,bytes_written);
            }
            if ((data->req).chunk == true) {
              uVar30 = uVar31 & 0xffffffff;
              code = Curl_httpchunk_read(conn,(data->req).str,bytes_written,&bytes_written);
              if (code < CHUNKE_TOO_LONG_HEX) {
                if (code == CHUNKE_STOP) {
                  piVar2 = &(data->req).keepon;
                  *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                  sVar27 = (conn->chunk).dataleft;
                  if (sVar27 != 0) {
                    local_60 = sVar27;
                    Curl_infof(conn->data,"Leftovers after chunking: %zu bytes\n");
                    _Var18 = Curl_pipeline_wanted(conn->data->multi,1);
                    if (_Var18) {
                      Curl_infof(conn->data,"Rewinding %zu bytes\n",local_60);
                      conn->read_pos = conn->read_pos - local_60;
                      (conn->bits).stream_was_rewound = true;
                    }
                  }
                }
              }
              else if (code == CHUNKE_WRITE_ERROR) {
                Curl_failf(data,"Failed writing data");
                local_68 = CURLE_WRITE_ERROR;
              }
              else {
                pcVar24 = Curl_chunked_strerror(code);
                Curl_failf(data,"%s in chunked-encoding",pcVar24);
                local_68 = CURLE_RECV_ERROR;
              }
              local_60 = CONCAT44(local_60._4_4_,1);
              if (CHUNKE_OK < code) goto LAB_00438ce1;
            }
            if (((data->req).badheader == HEADER_PARTHEADER) && ((data->req).ignorebody == false)) {
              pcVar7 = &(data->req).bytecount;
              *pcVar7 = *pcVar7 + (data->req).hbuflen;
            }
            lVar23 = (data->req).maxdownload;
            uVar30 = uVar31 & 0xffffffff;
            if (lVar23 != -1) {
              lVar35 = bytes_written + (data->req).bytecount;
              lVar36 = lVar35 - lVar23;
              if (lVar23 <= lVar35) {
                if ((lVar36 != 0) && ((data->req).ignorebody == false)) {
                  _Var18 = Curl_pipeline_wanted(conn->data->multi,1);
                  if (_Var18) {
                    Curl_infof(data,
                               "Rewinding stream by : %zu bytes on url %s (size = %ld, maxdownload = %ld, bytecount = %ld, nread = %zd)\n"
                               ,lVar36,(data->state).up.path,(data->req).size,
                               (data->req).maxdownload,(data->req).bytecount,bytes_written);
                    conn->read_pos = conn->read_pos - lVar36;
                    (conn->bits).stream_was_rewound = true;
                  }
                  else {
                    Curl_infof(data,
                               "Excess found in a non pipelined read: excess = %zu, size = %ld, maxdownload = %ld, bytecount = %ld\n"
                               ,lVar36,(data->req).size,(data->req).maxdownload,
                               (data->req).bytecount);
                  }
                }
                bytes_written = (data->req).maxdownload - (data->req).bytecount;
                if (bytes_written < 1) {
                  bytes_written = 0;
                }
                piVar2 = &(data->req).keepon;
                *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
                local_40 = lVar36;
              }
            }
            lVar23 = (data->req).bytecount + bytes_written;
            (data->req).bytecount = lVar23;
            Curl_pgrsSetDownloadCounter(data,lVar23);
            if (((data->req).chunk == false) &&
               ((bytes_written != 0 || ((data->req).badheader != HEADER_NORMAL || (uVar31 & 1) != 0)
                ))) {
              if (((data->req).badheader != HEADER_NORMAL) && ((data->req).ignorebody == false)) {
                sVar27 = (data->req).maxdownload;
                if ((sVar27 == 0xffffffffffffffff) || ((long)(data->req).hbuflen <= (long)sVar27)) {
                  pcVar24 = (data->state).headerbuff;
                  sVar27 = (data->req).hbuflen;
                }
                else {
                  pcVar24 = (data->state).headerbuff;
                }
                CVar19 = Curl_client_write(conn,1,pcVar24,sVar27);
                local_60 = CONCAT44(local_60._4_4_,1);
                uVar31 = extraout_RDX_06;
                if (CVar19 != CURLE_OK) goto LAB_00438bc0;
                CVar19 = CURLE_OK;
              }
              if ((data->req).badheader < HEADER_ALLBAD) {
                if (((conn->data->set).http_ce_skip == false) &&
                   (writer = (data->req).writer_stack, writer != (contenc_writer *)0x0)) {
                  if ((data->req).ignorebody == false) {
                    CVar19 = Curl_unencode_write(conn,writer,(data->req).str,bytes_written);
                  }
                }
                else if ((data->req).ignorebody == false) {
                  CVar19 = Curl_client_write(conn,1,(data->req).str,bytes_written);
                }
              }
              (data->req).badheader = HEADER_NORMAL;
              local_60 = CONCAT44(local_60._4_4_,1);
              uVar31 = uVar30;
              if (CVar19 != CURLE_OK) goto LAB_00438bc0;
              CVar19 = CURLE_OK;
            }
          }
          p_Var6 = conn->handler->readwrite;
          if (((p_Var6 == (_func_CURLcode_Curl_easy_ptr_connectdata_ptr_ssize_t_ptr__Bool_ptr *)0x0)
              || (local_40 == 0)) || ((conn->bits).stream_was_rewound != false)) {
            iVar38 = 0;
            local_60 = CONCAT44(local_60._4_4_,1);
            if ((char)uVar30 != '\0') {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 & 0xfe;
            }
          }
          else {
            pcVar24 = (data->req).str + bytes_written;
            (data->req).str = pcVar24;
            pcVar32 = (data->req).buf + (data->set).buffer_size;
            bytes_written = local_40;
            if (pcVar32 < pcVar24 + local_40) {
              bytes_written = (long)pcVar32 - (long)pcVar24;
            }
            local_40 = bytes_written;
            CVar19 = (*p_Var6)(data,conn,&bytes_written,&readmore);
            local_60 = CONCAT44(local_60._4_4_,1);
            uVar31 = extraout_RDX_05;
            if (CVar19 != CURLE_OK) goto LAB_00438bc0;
            iVar38 = 2;
            uVar30 = extraout_RDX_05;
            CVar19 = CURLE_OK;
            if (readmore == true) {
              piVar2 = &(data->req).keepon;
              *(byte *)piVar2 = (byte)*piVar2 | 1;
              CVar19 = CURLE_OK;
            }
          }
        }
      }
      else {
        CVar19 = Curl_read(conn,conn->sockfd,(data->req).buf,sVar27,&bytes_written);
        uVar30 = extraout_RDX_00;
        if (CVar19 == CURLE_OK) goto LAB_00438b0e;
        iVar38 = 2;
        uVar31 = extraout_RDX_00;
        uVar30 = extraout_RDX_00;
        if (CVar19 == CURLE_AGAIN) goto LAB_00438be2;
LAB_00438bc0:
        iVar38 = 1;
        uVar30 = uVar31;
        local_68 = CVar19;
      }
LAB_00438be2:
      if (iVar38 != 0) {
        if (iVar38 == 2) goto LAB_0043956a;
        comeback = (_Bool *)(ulong)local_68;
        done = local_50;
        uVar37 = (uint)local_60;
        uVar34 = local_44;
        goto LAB_004395c6;
      }
      if (((conn->handler->protocol & 0x30) == 0) &&
         (_Var18 = Curl_ssl_data_pending(conn,0), uVar30 = extraout_RDX_03, !_Var18))
      goto LAB_0043956a;
      bVar39 = iVar20 != 0;
      iVar20 = iVar20 + -1;
    } while (bVar39);
    iVar20 = -1;
LAB_0043956a:
    uVar34 = local_44;
    done = local_50;
    if (iVar20 < 1) {
      conn->cselect_bits = 1;
      *local_38 = true;
    }
    comeback = (_Bool *)0x0;
    uVar37 = (uint)local_60;
    if ((((data->req).keepon & 3U) == 2) && ((conn->bits).close == true)) {
      comeback = (_Bool *)0x0;
      Curl_infof(data,"we are done reading and this is set to close, stop send\n");
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
    }
LAB_004395c6:
    if (((int)comeback != 0) || (*done != false)) goto LAB_0043987f;
  }
  if ((uVar34 & (data->req).keepon & 2) != 0) {
    if (((data->req).bytecount == 0) && ((data->req).writebytecount == 0)) {
      Curl_pgrsTime(data,TIMER_STARTTRANSFER);
    }
    uVar34 = uVar37 | 2;
    if ((data->req).upload_present == 0) {
      if ((data->state).ulbuf == (char *)0x0) {
        pcVar24 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size);
        (data->state).ulbuf = pcVar24;
        if (pcVar24 != (char *)0x0) goto LAB_0043942d;
        CVar19 = CURLE_OUT_OF_MEMORY;
        bVar39 = false;
      }
      else {
LAB_0043942d:
        CVar19 = CURLE_OK;
        bVar39 = true;
      }
      if (!bVar39) goto LAB_004395fe;
      (data->req).upload_fromhere = (data->state).ulbuf;
      if ((data->req).upload_done == false) {
        pvVar9 = (data->req).protop;
        if (((data->req).exp100 == EXP100_SENDING_REQUEST) && (*(int *)((long)pvVar9 + 0x218) == 2))
        {
          (data->req).exp100 = EXP100_AWAITING_CONTINUE;
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
          cVar40 = Curl_now();
          (data->req).start100.tv_sec = cVar40.tv_sec;
          (data->req).start100.tv_usec = cVar40.tv_usec;
          uVar34 = uVar37 & 0xfffffffd;
          bVar39 = false;
          Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
          iVar20 = 2;
        }
        else {
          pCVar28 = conn->handler;
          if ((pCVar28->protocol & 0x40003) == 0) {
            bVar39 = false;
          }
          else {
            bVar39 = *(int *)((long)pvVar9 + 0x218) == 1;
          }
          CVar21 = Curl_fillreadbuffer(conn,(data->set).upload_buffer_size,(size_t *)&bytes_written)
          ;
          CVar19 = (CURLcode)pCVar28;
          if (CVar21 == CURLE_OK) {
            iVar20 = 0;
            comeback = (_Bool *)bytes_written;
          }
          else {
            iVar20 = 1;
            CVar19 = CVar21;
          }
        }
        if (iVar20 != 2) {
          if (iVar20 != 0) goto LAB_004395fe;
          goto LAB_004398cd;
        }
      }
      else {
        bVar39 = false;
        comeback = (_Bool *)0x0;
LAB_004398cd:
        if ((comeback != (_Bool *)0x0) || (((data->req).keepon & 0x20) == 0)) {
          if (0 < (long)comeback) {
            (data->req).upload_present = (ssize_t)comeback;
            if ((bVar39) || (((data->set).prefer_ascii == false && ((data->set).crlf != true))))
            goto LAB_00438a21;
            if ((data->state).scratch == (char *)0x0) {
              pcVar24 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size * 2);
              (data->state).scratch = pcVar24;
              if (pcVar24 == (char *)0x0) {
                Curl_failf(data,"Failed to alloc scratch buffer!");
                CVar19 = CURLE_OUT_OF_MEMORY;
                goto LAB_004395fe;
              }
            }
            p_Var26 = (_Bool *)0x1;
            if (1 < (long)comeback) {
              p_Var26 = comeback;
            }
            p_Var29 = (_Bool *)0x0;
            p_Var33 = (_Bool *)0x0;
            do {
              cVar5 = (data->req).upload_fromhere[(long)p_Var29];
              pcVar24 = (data->state).scratch;
              if (cVar5 == '\n') {
                p_Var1 = p_Var33 + 1;
                pcVar24[(long)p_Var33] = '\r';
                ((data->state).scratch + 1)[(long)p_Var33] = '\n';
                p_Var33 = p_Var1;
                if (((data->set).crlf == false) && (lVar23 = (data->state).infilesize, lVar23 != -1)
                   ) {
                  (data->state).infilesize = lVar23 + 1;
                }
              }
              else {
                pcVar24[(long)p_Var33] = cVar5;
              }
              p_Var29 = p_Var29 + 1;
              p_Var33 = p_Var33 + 1;
            } while (p_Var26 != p_Var29);
            if (p_Var33 != comeback) {
              (data->req).upload_fromhere = (data->state).scratch;
              (data->req).upload_present = (ssize_t)p_Var33;
            }
            goto LAB_00438a21;
          }
          piVar2 = &(data->req).keepon;
          *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
          if (((conn->bits).rewindaftersend != true) ||
             (CVar19 = Curl_readrewind(conn), CVar19 == CURLE_OK)) {
            CVar19 = CURLE_OK;
          }
          if (CVar19 != CURLE_OK) goto LAB_004395fe;
        }
      }
LAB_004395fc:
      CVar19 = CURLE_OK;
    }
    else {
LAB_00438a21:
      CVar19 = Curl_write(conn,conn->writesockfd,(data->req).upload_fromhere,
                          (data->req).upload_present,&bytes_written);
      if (CVar19 == CURLE_OK) {
        if ((data->set).verbose == true) {
          Curl_debug(data,CURLINFO_DATA_OUT,(data->req).upload_fromhere,bytes_written);
        }
        lVar23 = (data->req).writebytecount + bytes_written;
        (data->req).writebytecount = lVar23;
        if ((((data->req).upload_chunky != true) || ((data->req).forbidchunk == true)) &&
           (lVar23 == (data->state).infilesize)) {
          (data->req).upload_done = true;
          Curl_infof(data,"We are completely uploaded and fine\n");
        }
        lVar23 = (data->req).upload_present - bytes_written;
        if (lVar23 == 0) {
          if ((data->state).ulbuf == (char *)0x0) {
            pcVar24 = (char *)(*Curl_cmalloc)((data->set).upload_buffer_size);
            (data->state).ulbuf = pcVar24;
            if (pcVar24 != (char *)0x0) goto LAB_00439506;
            CVar19 = CURLE_OUT_OF_MEMORY;
            bVar39 = false;
          }
          else {
LAB_00439506:
            CVar19 = CURLE_OK;
            bVar39 = true;
          }
          if (!bVar39) goto LAB_004395fe;
          (data->req).upload_fromhere = (data->state).ulbuf;
          (data->req).upload_present = 0;
          if ((data->req).upload_done == true) {
            piVar2 = &(data->req).keepon;
            *(byte *)piVar2 = (byte)*piVar2 & 0xfd;
            if (((conn->bits).rewindaftersend != true) ||
               (CVar19 = Curl_readrewind(conn), CVar19 == CURLE_OK)) {
              CVar19 = CURLE_OK;
            }
            if (CVar19 != CURLE_OK) goto LAB_004395fe;
          }
        }
        else {
          (data->req).upload_present = lVar23;
          ppcVar4 = &(data->req).upload_fromhere;
          *ppcVar4 = *ppcVar4 + bytes_written;
        }
        Curl_pgrsSetUploadCounter(data,(data->req).writebytecount);
        goto LAB_004395fc;
      }
    }
LAB_004395fe:
    uVar37 = uVar34;
    comeback = (_Bool *)(ulong)CVar19;
    if (CVar19 != CURLE_OK) goto LAB_0043987f;
  }
  cVar40 = Curl_now();
  (data->req).now.tv_sec = cVar40.tv_sec;
  (data->req).now.tv_usec = cVar40.tv_usec;
  if (uVar37 == 0) {
    if (((data->req).exp100 == EXP100_AWAITING_CONTINUE) &&
       (uVar10 = (data->req).start100.tv_sec, uVar11 = (data->req).start100.tv_usec,
       older.tv_usec = uVar11, older.tv_sec = uVar10, older._12_4_ = 0, newer._12_4_ = 0,
       newer.tv_sec = SUB128(cVar40._0_12_,0), newer.tv_usec = SUB124(cVar40._0_12_,8),
       tVar25 = Curl_timediff(newer,older), (data->set).expect_100_timeout <= tVar25)) {
      (data->req).exp100 = EXP100_SEND_DATA;
      piVar2 = &(data->req).keepon;
      *(byte *)piVar2 = (byte)*piVar2 | 2;
      Curl_expire_done(data,EXPIRE_100_TIMEOUT);
      Curl_infof(data,"Done waiting for 100-continue\n");
    }
  }
  else {
    pcVar7 = (data->req).bytecountp;
    if (pcVar7 != (curl_off_t *)0x0) {
      *pcVar7 = (data->req).bytecount;
    }
    pcVar7 = (data->req).writebytecountp;
    if (pcVar7 != (curl_off_t *)0x0) {
      *pcVar7 = (data->req).writebytecount;
    }
  }
  iVar20 = Curl_pgrsUpdate(conn);
  comeback = (_Bool *)0x2a;
  if (iVar20 == 0) {
    uVar12 = (data->req).now.tv_sec;
    uVar13 = (data->req).now.tv_usec;
    cVar40.tv_usec = uVar13;
    cVar40.tv_sec = uVar12;
    cVar40._12_4_ = 0;
    CVar19 = Curl_speedcheck(data,cVar40);
    comeback = (_Bool *)(ulong)CVar19;
  }
  if ((int)comeback != 0) goto LAB_0043987f;
  if ((data->req).keepon == 0) {
    if ((data->set).opt_no_body == false) {
      lVar23 = (data->req).size;
      if ((((lVar23 == -1) || (lVar35 = (data->req).bytecount, lVar23 == lVar35)) ||
          (lVar35 == lVar23 + (data->state).crlf_conversions)) ||
         ((data->req).newurl != (char *)0x0)) {
        if (((data->req).chunk != true) || ((conn->chunk).state == CHUNK_STOP)) goto LAB_004397ae;
        Curl_failf(data,"transfer closed with outstanding read data remaining");
      }
      else {
        Curl_failf(data,"transfer closed with %ld bytes remaining to read");
      }
      comeback = (_Bool *)0x12;
      goto LAB_0043987f;
    }
LAB_004397ae:
    iVar20 = Curl_pgrsUpdate(conn);
    comeback = (_Bool *)0x2a;
    if (iVar20 != 0) goto LAB_0043987f;
  }
  else {
    tVar25 = Curl_timeleft(data,&(data->req).now,false);
    if (tVar25 < 0) {
      lVar23 = (data->req).size;
      uVar16 = (data->req).now.tv_sec;
      uVar17 = (data->req).now.tv_usec;
      newer_00.tv_usec = uVar17;
      newer_00.tv_sec = uVar16;
      uVar14 = (data->progress).t_startsingle.tv_sec;
      uVar15 = (data->progress).t_startsingle.tv_usec;
      older_00.tv_usec = uVar15;
      older_00.tv_sec = uVar14;
      older_00._12_4_ = 0;
      newer_00._12_4_ = 0;
      tVar25 = Curl_timediff(newer_00,older_00);
      cVar8 = (data->req).bytecount;
      if (lVar23 == -1) {
        Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",tVar25,
                   cVar8);
      }
      else {
        Curl_failf(data,
                   "Operation timed out after %ld milliseconds with %ld out of %ld bytes received",
                   tVar25,cVar8,(data->req).size);
      }
      comeback = (_Bool *)0x1c;
      goto LAB_0043987f;
    }
  }
  *done = ((data->req).keepon & 0x33) == 0;
  comeback = (_Bool *)0x0;
LAB_0043987f:
  return (CURLcode)comeback;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat = 0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_now();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      timediff_t ms = Curl_timediff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        Curl_expire_done(data, EXPIRE_100_TIMEOUT);
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_timediff(k->now, data->progress.t_startsingle),
              k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !k->newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    if(!(data->set.opt_no_body) && k->chunk &&
       (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}